

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_printf_as_uint32_array(run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint local_30;
  uint32_t j_1;
  int iStack_24;
  uint16_t le_1;
  uint32_t run_start_1;
  int32_t i;
  uint32_t j;
  uint16_t le;
  uint32_t run_start;
  uint32_t base_local;
  run_container_t *cont_local;
  
  if (cont->n_runs != 0) {
    uVar3 = base + cont->runs->value;
    uVar1 = cont->runs->length;
    printf("%u",(ulong)uVar3);
    for (run_start_1 = 1; run_start_1 <= uVar1; run_start_1 = run_start_1 + 1) {
      printf(",%u",(ulong)(uVar3 + run_start_1));
    }
    for (iStack_24 = 1; iStack_24 < cont->n_runs; iStack_24 = iStack_24 + 1) {
      uVar1 = cont->runs[iStack_24].value;
      uVar2 = cont->runs[iStack_24].length;
      for (local_30 = 0; local_30 <= uVar2; local_30 = local_30 + 1) {
        printf(",%u",(ulong)(base + uVar1 + local_30));
      }
    }
  }
  return;
}

Assistant:

void run_container_printf_as_uint32_array(const run_container_t *cont,
                                          uint32_t base) {
    if (cont->n_runs == 0) return;
    {
        uint32_t run_start = base + cont->runs[0].value;
        uint16_t le = cont->runs[0].length;
        printf("%u", run_start);
        for (uint32_t j = 1; j <= le; ++j) printf(",%u", run_start + j);
    }
    for (int32_t i = 1; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (uint32_t j = 0; j <= le; ++j) printf(",%u", run_start + j);
    }
}